

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  pointer pbVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  AssertHelper local_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  allocator<char> local_91;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70 [32];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,(test_property->key_)._M_dataplus._M_p,&local_91);
  GetReservedAttributesForElement(&local_90,xml_element);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_90.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_90.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_70);
  pbVar1 = local_90.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current !=
      local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Message::Message((Message *)&local_a0);
    std::operator<<((ostream *)(local_a0.ptr_ + 0x10),"Reserved key used in RecordProperty(): ");
    std::operator<<((ostream *)(local_a0.ptr_ + 0x10),local_70);
    std::operator<<((ostream *)(local_a0.ptr_ + 0x10)," (");
    local_78 = _Var2._M_current;
    Message::Message((Message *)&local_a8);
    lVar5 = 0;
    for (uVar4 = 0;
        uVar3 = (long)local_90.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5, uVar4 < uVar3;
        uVar4 = uVar4 + 1) {
      if ((uVar4 != 0) && (2 < uVar3)) {
        std::operator<<((ostream *)&(local_a8.data_)->line,", ");
        uVar3 = (long)local_90.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      if (uVar4 == uVar3 - 1) {
        std::operator<<((ostream *)&(local_a8.data_)->line,"and ");
      }
      std::operator<<((ostream *)&(local_a8.data_)->line,"\'");
      std::operator<<((ostream *)&(local_a8.data_)->line,
                      (string *)
                      ((long)&((local_90.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar5));
      std::operator<<((ostream *)&(local_a8.data_)->line,"\'");
      lVar5 = lVar5 + 0x20;
    }
    internal::StringStreamToString(&local_50,(stringstream *)local_a8.data_);
    internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
    std::operator<<((ostream *)(local_a0.ptr_ + 0x10),(string *)&local_50);
    _Var2._M_current = local_78;
    std::operator<<((ostream *)(local_a0.ptr_ + 0x10)," are reserved by ");
    std::operator<<((ostream *)(local_a0.ptr_ + 0x10),"Google Test");
    std::operator<<((ostream *)(local_a0.ptr_ + 0x10),")");
    internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/gtest/src/gtest-all.cc"
               ,0xe3a,"Failed");
    internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_50);
    internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  std::__cxx11::string::~string(local_70);
  return _Var2._M_current == pbVar1;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}